

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_context_create_compiler
          (spvc_context context,spvc_backend backend,spvc_parsed_ir parsed_ir,spvc_capture_mode mode
          ,spvc_compiler *compiler)

{
  long *plVar1;
  size_t sVar2;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> _Var3;
  CompilerMSL *this;
  spvc_result sVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [48];
  
  _Var3._M_head_impl = (ScratchMemoryAllocation *)operator_new(0x20,(nothrow_t *)&std::nothrow);
  if (_Var3._M_head_impl == (ScratchMemoryAllocation *)0x0) {
    _Var3._M_head_impl = (ScratchMemoryAllocation *)0x0;
  }
  else {
    (_Var3._M_head_impl)->_vptr_ScratchMemoryAllocation =
         (_func_int **)&PTR__spvc_compiler_s_0050a958;
    _Var3._M_head_impl[1]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
    _Var3._M_head_impl[2]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
    *(undefined4 *)&_Var3._M_head_impl[3]._vptr_ScratchMemoryAllocation = 0;
  }
  if (_Var3._M_head_impl == (ScratchMemoryAllocation *)0x0) {
    puVar6 = local_60;
    local_70[0] = puVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Out of memory.","");
    std::__cxx11::string::operator=((string *)context,(string *)local_70);
    if (context->callback != (spvc_error_callback)0x0) {
      (*context->callback)(context->callback_userdata,(context->last_error)._M_dataplus._M_p);
    }
    sVar4 = SPVC_ERROR_OUT_OF_MEMORY;
    puVar5 = local_70[0];
  }
  else {
    *(spvc_backend *)((long)_Var3._M_head_impl + 0x18) = backend;
    *(spvc_context *)((long)_Var3._M_head_impl + 8) = context;
    if (mode < 2) {
      switch(backend) {
      case SPVC_BACKEND_NONE:
        if ((mode & SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) == SPVC_CAPTURE_MODE_COPY) {
          this = (CompilerMSL *)operator_new(0xc68);
          spirv_cross::Compiler::Compiler((Compiler *)this,&parsed_ir->parsed);
        }
        else {
          this = (CompilerMSL *)operator_new(0xc68);
          spirv_cross::Compiler::Compiler((Compiler *)this,&parsed_ir->parsed);
        }
        break;
      case SPVC_BACKEND_GLSL:
        if ((mode & SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) == SPVC_CAPTURE_MODE_COPY) {
          this = (CompilerMSL *)operator_new(0x2678);
          spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)this,&parsed_ir->parsed);
        }
        else {
          this = (CompilerMSL *)operator_new(0x2678);
          spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)this,&parsed_ir->parsed);
        }
        break;
      case SPVC_BACKEND_HLSL:
        if ((mode & SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) == SPVC_CAPTURE_MODE_COPY) {
          this = (CompilerMSL *)operator_new(0x2920);
          spirv_cross::CompilerHLSL::CompilerHLSL((CompilerHLSL *)this,&parsed_ir->parsed);
        }
        else {
          this = (CompilerMSL *)operator_new(0x2920);
          spirv_cross::CompilerHLSL::CompilerHLSL((CompilerHLSL *)this,&parsed_ir->parsed);
        }
        break;
      case SPVC_BACKEND_MSL:
        if ((mode & SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) == SPVC_CAPTURE_MODE_COPY) {
          this = (CompilerMSL *)operator_new(0x30b0);
          spirv_cross::CompilerMSL::CompilerMSL(this,&parsed_ir->parsed);
        }
        else {
          this = (CompilerMSL *)operator_new(0x30b0);
          spirv_cross::CompilerMSL::CompilerMSL(this,&parsed_ir->parsed);
        }
        break;
      case SPVC_BACKEND_CPP:
        if ((mode & SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) == SPVC_CAPTURE_MODE_COPY) {
          this = (CompilerMSL *)operator_new(0x27f8);
          spirv_cross::CompilerCPP::CompilerCPP((CompilerCPP *)this,&parsed_ir->parsed);
        }
        else {
          this = (CompilerMSL *)operator_new(0x27f8);
          spirv_cross::CompilerCPP::CompilerCPP((CompilerCPP *)this,&parsed_ir->parsed);
        }
        break;
      case SPVC_BACKEND_JSON:
        if ((mode & SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) == SPVC_CAPTURE_MODE_COPY) {
          this = (CompilerMSL *)operator_new(0x2688);
          spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)this,&parsed_ir->parsed);
        }
        else {
          this = (CompilerMSL *)operator_new(0x2688);
          spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)this,&parsed_ir->parsed);
        }
        (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
             (_func_int **)&PTR__CompilerReflection_0050ca78;
        (((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *)&this->function_global_vars)->
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        (((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *)&this->function_global_vars)->
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).buffer_size = 0;
        (this->super_CompilerGLSL).options.vulkan_semantics = true;
        break;
      default:
        puVar6 = local_a0;
        local_b0[0] = puVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Invalid backend.","");
        std::__cxx11::string::operator=((string *)context,(string *)local_b0);
        puVar5 = local_b0[0];
        if (context->callback != (spvc_error_callback)0x0) {
          (*context->callback)(context->callback_userdata,(context->last_error)._M_dataplus._M_p);
          puVar5 = local_b0[0];
        }
        goto LAB_00213f1a;
      }
      plVar1 = *(long **)((long)_Var3._M_head_impl + 0x10);
      *(CompilerMSL **)((long)_Var3._M_head_impl + 0x10) = this;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
      *compiler = (spvc_compiler)_Var3._M_head_impl;
      spirv_cross::
      SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
      ::reserve(&context->allocations,
                (context->allocations).
                super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
                .buffer_size + 1);
      sVar2 = (context->allocations).
              super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
              .buffer_size;
      (context->allocations).
      super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
      .ptr[sVar2]._M_t.
      super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>.
      _M_t.
      super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
      .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
           (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)_Var3._M_head_impl;
      (context->allocations).
      super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
      .buffer_size = sVar2 + 1;
      _Var3._M_head_impl = (ScratchMemoryAllocation *)0x0;
      sVar4 = SPVC_SUCCESS;
      goto LAB_00214204;
    }
    puVar6 = local_80;
    local_90[0] = puVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Invalid argument for capture mode.","");
    std::__cxx11::string::operator=((string *)context,(string *)local_90);
    puVar5 = local_90[0];
    if (context->callback != (spvc_error_callback)0x0) {
      (*context->callback)(context->callback_userdata,(context->last_error)._M_dataplus._M_p);
      puVar5 = local_90[0];
    }
LAB_00213f1a:
    sVar4 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  if (puVar5 != puVar6) {
    operator_delete(puVar5);
  }
LAB_00214204:
  if (_Var3._M_head_impl != (ScratchMemoryAllocation *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_ScratchMemoryAllocation[1])(_Var3._M_head_impl);
  }
  return sVar4;
}

Assistant:

spvc_result spvc_context_create_compiler(spvc_context context, spvc_backend backend, spvc_parsed_ir parsed_ir,
                                         spvc_capture_mode mode, spvc_compiler *compiler)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_compiler_s> comp(new (std::nothrow) spvc_compiler_s);
		if (!comp)
		{
			context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}
		comp->backend = backend;
		comp->context = context;

		if (mode != SPVC_CAPTURE_MODE_COPY && mode != SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
		{
			context->report_error("Invalid argument for capture mode.");
			return SPVC_ERROR_INVALID_ARGUMENT;
		}

		switch (backend)
		{
		case SPVC_BACKEND_NONE:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new Compiler(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new Compiler(parsed_ir->parsed));
			break;

#if SPIRV_CROSS_C_API_GLSL
		case SPVC_BACKEND_GLSL:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerGLSL(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerGLSL(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_HLSL
		case SPVC_BACKEND_HLSL:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerHLSL(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerHLSL(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_MSL
		case SPVC_BACKEND_MSL:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerMSL(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerMSL(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_CPP
		case SPVC_BACKEND_CPP:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerCPP(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerCPP(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_REFLECT
		case SPVC_BACKEND_JSON:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerReflection(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerReflection(parsed_ir->parsed));
			break;
#endif

		default:
			context->report_error("Invalid backend.");
			return SPVC_ERROR_INVALID_ARGUMENT;
		}

		*compiler = comp.get();
		context->allocations.push_back(std::move(comp));
	}